

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

result_type_conflict
time_plain<boost::random::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>>
          (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *r)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  result_type_conflict rVar4;
  bool bVar5;
  double extraout_XMM0_Qa;
  timer T;
  string res;
  double local_20;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  uVar3 = (ulong)r->_x;
  rVar4 = 0;
  lVar2 = 0x1000000;
  while( true ) {
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar5) break;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3 * 0xbc8f;
    uVar3 = SUB168(auVar1 % ZEXT816(0x7fffffff),0);
    rVar4 = rVar4 + SUB164(auVar1 % ZEXT816(0x7fffffff),0);
  }
  r->_x = (uint)uVar3;
  timer::time(&T,(time_t *)0x7fffffff);
  local_20 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_20);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return rVar4;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}